

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_v128.h
# Opt level: O2

v256 * v256_ziplo_32(v256 a,v256 b)

{
  v256 *in_RDI;
  
  *(undefined4 *)in_RDI->val[1] = (undefined4)b.val[0][1];
  *(undefined4 *)((long)in_RDI->val[1] + 4) = (undefined4)a.val[0][1];
  *(undefined4 *)(in_RDI->val[1] + 1) = b.val[0][1]._4_4_;
  *(undefined4 *)((long)in_RDI->val[1] + 0xc) = a.val[0][1]._4_4_;
  *(undefined4 *)in_RDI->val[0] = (undefined4)b.val[0][0];
  *(undefined4 *)((long)in_RDI->val[0] + 4) = (undefined4)a.val[0][0];
  *(undefined4 *)(in_RDI->val[0] + 1) = b.val[0][0]._4_4_;
  *(undefined4 *)((long)in_RDI->val[0] + 0xc) = a.val[0][0]._4_4_;
  return in_RDI;
}

Assistant:

SIMD_INLINE v256 v256_ziplo_32(v256 a, v256 b) {
  return v256_from_v128(v128_ziphi_32(a.val[0], b.val[0]),
                        v128_ziplo_32(a.val[0], b.val[0]));
}